

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall ImFont::GrowIndex(ImFont *this,int new_size)

{
  int iVar1;
  float *__dest;
  unsigned_short *__dest_00;
  int iVar2;
  long lVar3;
  float *pfVar4;
  unsigned_short *puVar5;
  long lVar6;
  
  iVar1 = (this->IndexXAdvance).Size;
  lVar6 = (long)iVar1;
  if (iVar1 != (this->IndexLookup).Size) {
    __assert_fail("IndexXAdvance.Size == IndexLookup.Size",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui_draw.cpp"
                  ,0x77a,"void ImFont::GrowIndex(int)");
  }
  if (iVar1 < new_size) {
    iVar2 = (this->IndexXAdvance).Capacity;
    if (iVar2 < new_size) {
      if (iVar2 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar2 / 2 + iVar2;
      }
      if (iVar2 <= new_size) {
        iVar2 = new_size;
      }
      __dest = (float *)ImGui::MemAlloc((long)iVar2 << 2);
      pfVar4 = (this->IndexXAdvance).Data;
      if (pfVar4 == (float *)0x0) {
        pfVar4 = (float *)0x0;
      }
      else {
        memcpy(__dest,pfVar4,(long)(this->IndexXAdvance).Size << 2);
        pfVar4 = (this->IndexXAdvance).Data;
      }
      ImGui::MemFree(pfVar4);
      (this->IndexXAdvance).Data = __dest;
      (this->IndexXAdvance).Capacity = iVar2;
    }
    (this->IndexXAdvance).Size = new_size;
    iVar2 = (this->IndexLookup).Capacity;
    if (iVar2 < new_size) {
      if (iVar2 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar2 / 2 + iVar2;
      }
      if (iVar2 <= new_size) {
        iVar2 = new_size;
      }
      __dest_00 = (unsigned_short *)ImGui::MemAlloc((long)iVar2 * 2);
      puVar5 = (this->IndexLookup).Data;
      if (puVar5 == (unsigned_short *)0x0) {
        puVar5 = (unsigned_short *)0x0;
      }
      else {
        memcpy(__dest_00,puVar5,(long)(this->IndexLookup).Size * 2);
        puVar5 = (this->IndexLookup).Data;
      }
      ImGui::MemFree(puVar5);
      (this->IndexLookup).Data = __dest_00;
      (this->IndexLookup).Capacity = iVar2;
    }
    (this->IndexLookup).Size = new_size;
    iVar2 = (this->IndexXAdvance).Size;
    if (iVar2 < iVar1) {
      iVar2 = iVar1;
    }
    pfVar4 = (this->IndexXAdvance).Data;
    puVar5 = (this->IndexLookup).Data;
    lVar3 = 0;
    do {
      if (iVar2 - lVar6 == lVar3) {
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/dependencies/imgui/imgui.h"
                      ,0x38b,"value_type &ImVector<float>::operator[](int) [T = float]");
      }
      pfVar4[lVar6 + lVar3] = -1.0;
      puVar5[lVar6 + lVar3] = 0xffff;
      lVar3 = lVar3 + 1;
    } while (new_size - iVar1 != (int)lVar3);
  }
  return;
}

Assistant:

void ImFont::GrowIndex(int new_size)
{
    IM_ASSERT(IndexXAdvance.Size == IndexLookup.Size);
    int old_size = IndexLookup.Size;
    if (new_size <= old_size)
        return;
    IndexXAdvance.resize(new_size);
    IndexLookup.resize(new_size);
    for (int i = old_size; i < new_size; i++)
    {
        IndexXAdvance[i] = -1.0f;
        IndexLookup[i] = (unsigned short)-1;
    }
}